

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryCopy(OptimizeInstructions *this,MemoryCopy *memCopy)

{
  PassRunner *pPVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  bool bVar4;
  Drop *pDVar5;
  Block *pBVar6;
  int64_t iVar7;
  Load *pLVar8;
  Store *pSVar9;
  ulong extraout_RDX;
  ulong uVar10;
  ulong extraout_RDX_00;
  initializer_list<wasm::Expression_*> *items;
  uintptr_t uVar11;
  MixedArena *pMVar12;
  optional<wasm::Type> type;
  Drop local_70;
  Drop local_58;
  Builder local_38;
  Builder builder;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if ((((pPVar1->options).ignoreImplicitTraps != false) ||
      ((pPVar1->options).trapsNeverHappen == true)) &&
     (bVar4 = areConsecutiveInputsEqual(this,memCopy->dest,memCopy->source), bVar4)) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    pEVar2 = memCopy->dest;
    pMVar12 = &(local_38.wasm)->allocator;
    pDVar5 = (Drop *)MixedArena::allocSpace(pMVar12,0x18,8);
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar5->value = pEVar2;
    Drop::finalize(pDVar5);
    pEVar2 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = pDVar5;
    pDVar5 = (Drop *)MixedArena::allocSpace(pMVar12,0x18,8);
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar5->value = pEVar2;
    Drop::finalize(pDVar5);
    pEVar2 = memCopy->size;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)pDVar5;
    pDVar5 = (Drop *)MixedArena::allocSpace(pMVar12,0x18,8);
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar5->value = pEVar2;
    Drop::finalize(pDVar5);
    items = (initializer_list<wasm::Expression_*> *)&local_70;
    local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 3;
    uVar10 = extraout_RDX;
    local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = &local_58;
    local_58.value = (Expression *)pDVar5;
LAB_009d3f14:
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
    pBVar6 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_38,items,type);
    return (Expression *)pBVar6;
  }
  if (memCopy->size->_id != ConstId) {
    return (Expression *)0x0;
  }
  iVar7 = Literal::getInteger((Literal *)(memCopy->size + 1));
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  switch(iVar7) {
  case 0:
    if (((pPVar1->options).ignoreImplicitTraps != false) ||
       ((pPVar1->options).trapsNeverHappen == true)) {
      pEVar2 = memCopy->dest;
      pMVar12 = &(local_38.wasm)->allocator;
      pDVar5 = (Drop *)MixedArena::allocSpace(pMVar12,0x18,8);
      (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar5->value = pEVar2;
      Drop::finalize(pDVar5);
      pEVar2 = memCopy->source;
      local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = pDVar5;
      pDVar5 = (Drop *)MixedArena::allocSpace(pMVar12,0x18,8);
      (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar5->value = pEVar2;
      Drop::finalize(pDVar5);
      items = (initializer_list<wasm::Expression_*> *)&local_58;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 2;
      uVar10 = extraout_RDX_00;
      local_70.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)pDVar5;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = &local_70
      ;
      goto LAB_009d3f14;
    }
    break;
  case 1:
  case 2:
  case 4:
    local_70.value = memCopy->dest;
    pEVar2 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    pMVar12 = &(local_38.wasm)->allocator;
    pLVar8 = (Load *)MixedArena::allocSpace(pMVar12,0x48,8);
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    pLVar8->isAtomic = false;
    pLVar8->bytes = (uint8_t)iVar7;
    pLVar8->signed_ = false;
    (pLVar8->offset).addr = 0;
    (pLVar8->align).addr = 1;
    pLVar8->ptr = pEVar2;
    uVar11 = 2;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (pLVar8->memory).super_IString.str._M_len =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pLVar8->memory).super_IString.str._M_str =
         (char *)local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Load::finalize(pLVar8);
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->destMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->destMemory).super_IString.str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(pMVar12,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar9->bytes = (uint8_t)iVar7;
    (pSVar9->align).addr = 1;
    pSVar9->ptr = local_70.value;
    pSVar9->value = (Expression *)pLVar8;
    goto LAB_009d4191;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    local_70.value = memCopy->dest;
    pEVar2 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    pMVar12 = &(local_38.wasm)->allocator;
    pLVar8 = (Load *)MixedArena::allocSpace(pMVar12,0x48,8);
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    pLVar8->isAtomic = false;
    pLVar8->bytes = '\b';
    pLVar8->signed_ = false;
    (pLVar8->offset).addr = 0;
    (pLVar8->align).addr = 1;
    pLVar8->ptr = pEVar2;
    uVar11 = 3;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 3;
    (pLVar8->memory).super_IString.str._M_len =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pLVar8->memory).super_IString.str._M_str =
         (char *)local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Load::finalize(pLVar8);
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->destMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->destMemory).super_IString.str._M_str;
    pSVar9 = (Store *)MixedArena::allocSpace(pMVar12,0x58,8);
    *(undefined8 *)&(pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar9->bytes = 0;
    (pSVar9->offset).addr = 0;
    (pSVar9->align).addr = 0;
    *(undefined8 *)&pSVar9->isAtomic = 0;
    (pSVar9->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar9->bytes = '\b';
    (pSVar9->align).addr = 1;
    pSVar9->ptr = local_70.value;
    pSVar9->value = (Expression *)pLVar8;
LAB_009d4191:
    (pSVar9->valueType).id = uVar11;
    (pSVar9->memory).super_IString.str._M_len =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (pSVar9->memory).super_IString.str._M_str =
         (char *)local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    Store::finalize(pSVar9);
    return (Expression *)pSVar9;
  default:
    if (((iVar7 == 0x10) && ((pPVar1->options).shrinkLevel == 0)) &&
       ((((local_38.wasm)->features).features & 8) != 0)) {
      pEVar2 = memCopy->dest;
      pEVar3 = memCopy->source;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
           (memCopy->sourceMemory).super_IString.str._M_len;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
      pLVar8 = (Load *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
      pLVar8->isAtomic = false;
      pLVar8->bytes = '\x10';
      pLVar8->signed_ = false;
      (pLVar8->offset).addr = 0;
      (pLVar8->align).addr = 1;
      pLVar8->ptr = pEVar3;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 6;
      (pLVar8->memory).super_IString.str._M_len =
           local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
      (pLVar8->memory).super_IString.str._M_str =
           (char *)local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type
                   .id;
      Load::finalize(pLVar8);
      pSVar9 = Builder::makeStore(&local_38,0x10,(Address)0x0,1,pEVar2,(Expression *)pLVar8,
                                  (Type)0x6,(Name)(memCopy->destMemory).super_IString.str);
      return (Expression *)pSVar9;
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* optimizeMemoryCopy(MemoryCopy* memCopy) {
    auto& options = getPassOptions();

    if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
      if (areConsecutiveInputsEqual(memCopy->dest, memCopy->source)) {
        // memory.copy(x, x, sz)  ==>  {drop(x), drop(x), drop(sz)}
        Builder builder(*getModule());
        return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                  builder.makeDrop(memCopy->source),
                                  builder.makeDrop(memCopy->size)});
      }
    }

    // memory.copy(dst, src, C)  ==>  store(dst, load(src))
    if (auto* csize = memCopy->size->dynCast<Const>()) {
      auto bytes = csize->value.getInteger();
      Builder builder(*getModule());

      switch (bytes) {
        case 0: {
          if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
            // memory.copy(dst, src, 0)  ==>  {drop(dst), drop(src)}
            return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                      builder.makeDrop(memCopy->source)});
          }
          break;
        }
        case 1:
        case 2:
        case 4: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i32,
                                                    memCopy->sourceMemory),
                                   Type::i32,
                                   memCopy->destMemory);
        }
        case 8: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i64,
                                                    memCopy->sourceMemory),
                                   Type::i64,
                                   memCopy->destMemory);
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            // This adds an extra 2 bytes so apply it only for
            // minimal shrink level
            if (getModule()->features.hasSIMD()) {
              return builder.makeStore(bytes, // bytes
                                       0,     // offset
                                       1,     // align
                                       memCopy->dest,
                                       builder.makeLoad(bytes,
                                                        false,
                                                        0,
                                                        1,
                                                        memCopy->source,
                                                        Type::v128,
                                                        memCopy->sourceMemory),
                                       Type::v128,
                                       memCopy->destMemory);
            }
          }
          break;
        }
        default: {
        }
      }
    }
    return nullptr;
  }